

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.cpp
# Opt level: O0

int mbedtls_gcm_auth_decrypt
              (mbedtls_gcm_context *ctx,size_t length,uchar *iv,size_t iv_len,uchar *add,
              size_t add_len,uchar *tag,size_t tag_len,uchar *input,uchar *output)

{
  int iVar1;
  size_t in_RCX;
  uchar *in_RDX;
  uchar *in_R8;
  uchar *in_R9;
  void *in_stack_00000008;
  uchar *in_stack_00000010;
  uchar *in_stack_00000018;
  size_t in_stack_00000020;
  int diff;
  uchar check_tag [16];
  int ret;
  int in_stack_ffffffffffffff94;
  mbedtls_gcm_context *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffb0;
  int local_14;
  
  local_14 = mbedtls_gcm_crypt_and_tag
                       (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                        (size_t)&stack0xffffffffffffff98,in_stack_00000010,in_stack_00000020,
                        in_stack_00000018,CONCAT44(0xffffff92,in_stack_ffffffffffffffb0),in_R9,in_R8
                        ,in_RCX,in_RDX);
  if (local_14 == 0) {
    iVar1 = mbedtls_ct_memcmp(in_stack_00000008,&stack0xffffffffffffff98,(size_t)in_stack_00000010);
    if (iVar1 == 0) {
      local_14 = 0;
    }
    else {
      mbedtls_platform_zeroize(in_stack_00000018,(size_t)in_R9);
      local_14 = -0x12;
    }
  }
  return local_14;
}

Assistant:

int mbedtls_gcm_auth_decrypt(mbedtls_gcm_context *ctx,
                             size_t length,
                             const unsigned char *iv,
                             size_t iv_len,
                             const unsigned char *add,
                             size_t add_len,
                             const unsigned char *tag,
                             size_t tag_len,
                             const unsigned char *input,
                             unsigned char *output)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char check_tag[16];
    int diff;

    if ((ret = mbedtls_gcm_crypt_and_tag(ctx, MBEDTLS_GCM_DECRYPT, length,
                                         iv, iv_len, add, add_len,
                                         input, output, tag_len, check_tag)) != 0) {
        return ret;
    }

    /* Check tag in "constant-time" */
    diff = mbedtls_ct_memcmp(tag, check_tag, tag_len);

    if (diff != 0) {
        mbedtls_platform_zeroize(output, length);
        return MBEDTLS_ERR_GCM_AUTH_FAILED;
    }

    return 0;
}